

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O1

void eltcalc::WriteOutput(char *buffer,int strLen,FILE *outFile)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  size_type __n;
  float *__dest;
  ulong uVar4;
  long lVar5;
  undefined4 *extraout_RDX;
  long lVar6;
  char *pcVar7;
  undefined4 *__src;
  size_t sVar8;
  char *pcVar9;
  undefined4 *__dest_00;
  uint uVar10;
  ulong uVar11;
  size_t __n_00;
  void *__dest_01;
  
  uVar11 = 1;
  pcVar7 = buffer;
  while( true ) {
    pcVar9 = "%s";
    uVar3 = fprintf((FILE *)outFile,"%s",pcVar7);
    if ((int)uVar3 < 0) {
      WriteOutput((eltcalc *)buffer);
      __src = *(undefined4 **)((new_allocator<float> *)buffer + 8);
      pcVar7 = (char *)((long)__src - *(long *)buffer >> 2);
      uVar11 = (long)pcVar9 - (long)pcVar7;
      if (pcVar9 < pcVar7 || uVar11 == 0) {
        if ((pcVar9 < pcVar7) &&
           (puVar1 = (undefined4 *)(*(long *)buffer + (long)pcVar9 * 4), __src != puVar1)) {
          *(undefined4 **)((new_allocator<float> *)buffer + 8) = puVar1;
        }
        return;
      }
      if (uVar11 != 0) {
        puVar1 = *(undefined4 **)((new_allocator<float> *)buffer + 8);
        if ((ulong)(*(long *)((new_allocator<float> *)buffer + 0x10) - (long)puVar1 >> 2) < uVar11)
        {
          __n = std::vector<float,_std::allocator<float>_>::_M_check_len
                          ((vector<float,_std::allocator<float>_> *)buffer,uVar11,
                           "vector::_M_fill_insert");
          lVar5 = *(long *)buffer;
          if (__n == 0) {
            __dest = (float *)0x0;
          }
          else {
            __dest = __gnu_cxx::new_allocator<float>::allocate
                               ((new_allocator<float> *)buffer,__n,(void *)0x0);
          }
          uVar2 = *extraout_RDX;
          lVar6 = 0;
          do {
            *(undefined4 *)((long)__dest + lVar6 + ((long)__src - lVar5 >> 2) * 4) = uVar2;
            lVar6 = lVar6 + 4;
          } while (uVar11 * 4 - lVar6 != 0);
          sVar8 = (long)__src - (long)*(void **)buffer;
          if (sVar8 != 0) {
            memmove(__dest,*(void **)buffer,sVar8);
          }
          __dest_01 = (void *)((long)__dest + uVar11 * 4 + sVar8);
          sVar8 = *(long *)((new_allocator<float> *)buffer + 8) - (long)__src;
          if (sVar8 != 0) {
            memmove(__dest_01,__src,sVar8);
          }
          if (*(void **)buffer != (void *)0x0) {
            operator_delete(*(void **)buffer);
          }
          *(float **)buffer = __dest;
          *(size_t *)((new_allocator<float> *)buffer + 8) = (long)__dest_01 + sVar8;
          *(float **)((new_allocator<float> *)buffer + 0x10) = __dest + __n;
        }
        else {
          uVar2 = *extraout_RDX;
          sVar8 = (long)puVar1 - (long)__src;
          uVar4 = (long)sVar8 >> 2;
          if (uVar11 < uVar4) {
            __n_00 = uVar11 * 4;
            memmove(puVar1,puVar1 + -uVar11,__n_00);
            *(size_t *)((new_allocator<float> *)buffer + 8) =
                 *(long *)((new_allocator<float> *)buffer + 8) + __n_00;
            sVar8 = (long)(puVar1 + -uVar11) - (long)__src;
            if (sVar8 != 0) {
              memmove((void *)((long)puVar1 - sVar8),__src,sVar8);
            }
            sVar8 = 0;
            do {
              *(undefined4 *)((long)__src + sVar8) = uVar2;
              sVar8 = sVar8 + 4;
            } while (__n_00 != sVar8);
          }
          else {
            __dest_00 = puVar1;
            if (uVar11 - uVar4 != 0) {
              __dest_00 = puVar1 + (uVar11 - uVar4);
              lVar5 = 0;
              do {
                *(undefined4 *)((long)puVar1 + lVar5) = uVar2;
                lVar5 = lVar5 + 4;
              } while (uVar11 * 4 + uVar4 * -4 != lVar5);
            }
            *(undefined4 **)((new_allocator<float> *)buffer + 8) = __dest_00;
            if (puVar1 == __src) {
              *(size_t *)((new_allocator<float> *)buffer + 8) =
                   *(long *)((new_allocator<float> *)buffer + 8) + sVar8;
            }
            else {
              memmove(__dest_00,__src,sVar8);
              *(size_t *)((new_allocator<float> *)buffer + 8) =
                   *(long *)((new_allocator<float> *)buffer + 8) + sVar8;
              do {
                *__src = uVar2;
                __src = __src + 1;
              } while (__src != puVar1);
            }
          }
        }
      }
      return;
    }
    if (strLen - uVar3 == 0 || strLen < (int)uVar3) break;
    pcVar7 = pcVar7 + uVar3;
    fprintf(_stderr,"INFO: Attempt %d to write %s\n",uVar11,buffer);
    uVar10 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar10;
    strLen = strLen - uVar3;
    if (uVar10 == 0xb) {
      WriteOutput((eltcalc *)buffer);
      return;
    }
  }
  return;
}

Assistant:

inline void WriteOutput(const char * buffer, int strLen, FILE * outFile)
	{
		const char * bufPtr = buffer;
		int num;
		int counter = 0;
		do {

			num = fprintf(outFile, "%s", bufPtr);
			if (num < 0) {   // Write error
				fprintf(stderr, "FATAL: Error writing %s: %s\n",
					buffer, strerror(errno));
				exit(EXIT_FAILURE);
			} else if (num < strLen) {   // Incomplete write
				bufPtr += num;
				strLen -= num;
			} else return;   // Success

			fprintf(stderr, "INFO: Attempt %d to write %s\n",
				++counter, buffer);

		} while (counter < 10);

		fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
			buffer);
		exit(EXIT_FAILURE);
	}